

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O0

Chunk * __thiscall Mempool::alloc_chunk(Mempool *this,int n)

{
  Chunk *pCVar1;
  mapped_type *ppCVar2;
  Mempool *pMVar3;
  Mempool *local_80;
  Chunk *target;
  Chunk *new_buf;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lck;
  uint local_20;
  int iStack_1c;
  bool found;
  int index;
  int n_local;
  Mempool *this_local;
  
  lck._M_device._7_1_ = '\0';
  local_20 = 0x1000;
  do {
    if (0x400000 < local_20) {
LAB_0012a119:
      if (lck._M_device._7_1_ == '\0') {
        this_local = (Mempool *)0x0;
      }
      else {
        iStack_1c = n;
        _index = this;
        std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mp_mutex);
        ppCVar2 = std::
                  unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
                  ::operator[](&this->mp_pool,(key_type *)&local_20);
        if (*ppCVar2 == (mapped_type)0x0) {
          if (0x3fffff < this->mp_total_size_kb + (long)((int)local_20 / 0x400)) {
            if (-1 < pr_level) {
              printf("[%-5s][%s:%d] beyond the limit size of memory!\n","error","alloc_chunk",0x3b);
            }
            exit(1);
          }
          pMVar3 = (Mempool *)operator_new(0x20,(nothrow_t *)&std::nothrow);
          local_80 = (Mempool *)0x0;
          if (pMVar3 != (Mempool *)0x0) {
            Chunk::Chunk((Chunk *)pMVar3,local_20);
            local_80 = pMVar3;
          }
          if (local_80 == (Mempool *)0x0) {
            if (-1 < pr_level) {
              printf("[%-5s][%s:%d] new chunk error\n","error","alloc_chunk",0x41);
            }
            exit(1);
          }
          this->mp_total_size_kb = (long)((int)local_20 / 0x400) + this->mp_total_size_kb;
          this_local = local_80;
        }
        else {
          ppCVar2 = std::
                    unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
                    ::operator[](&this->mp_pool,(key_type *)&local_20);
          pMVar3 = (Mempool *)*ppCVar2;
          pCVar1 = (Chunk *)(pMVar3->mp_pool)._M_h._M_element_count;
          ppCVar2 = std::
                    unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
                    ::operator[](&this->mp_pool,(key_type *)&local_20);
          *ppCVar2 = pCVar1;
          (pMVar3->mp_pool)._M_h._M_element_count = 0;
          this->mp_left_size_kb = this->mp_left_size_kb - (long)((int)local_20 / 0x400);
          this_local = pMVar3;
        }
        std::lock_guard<std::mutex>::~lock_guard(&local_30);
      }
      return (Chunk *)this_local;
    }
    if (n <= (int)local_20) {
      lck._M_device._7_1_ = '\x01';
      goto LAB_0012a119;
    }
    local_20 = local_20 << 2;
  } while( true );
}

Assistant:

Chunk *Mempool::alloc_chunk(int n) 
{
    int index;
    bool found = false;
    for(index = mLow; index <= mUp; index = index * MEM_CAP_MULTI_POWER)
    {
        if(n <= index)
        {
            found = true;
            break;
        }
    }

    if(!found)
    {
        return nullptr;
    }

    lock_guard<mutex> lck(mp_mutex);
    if (mp_pool[index] == nullptr) {
        if (mp_total_size_kb + index/1024 >= MAX_POOL_SIZE) {
            PR_ERROR("beyond the limit size of memory!\n");
            exit(1);
        }

        Chunk *new_buf = new (std::nothrow) Chunk(index);
        if (new_buf == nullptr) {
            PR_ERROR("new chunk error\n");
            exit(1);
        }
        mp_total_size_kb += index/1024;
        return new_buf;
    }

    Chunk *target = mp_pool[index];
    mp_pool[index] = target->next;
    target->next = nullptr;
    mp_left_size_kb -= index/1024;

    return target;
}